

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

size_t utf8cspn(void *src,void *reject)

{
  size_t offset;
  char *r;
  size_t chars;
  char *s;
  void *reject_local;
  void *src_local;
  
  chars = 0;
  s = (char *)src;
  do {
    if (*s == '\0') {
      return chars;
    }
    offset = 0;
    r = (char *)reject;
    while (*r != '\0') {
      if ((((int)*r & 0xc0U) != 0x80) && (offset != 0)) {
        return chars;
      }
      if (*r == s[offset]) {
        offset = offset + 1;
        r = r + 1;
      }
      else {
        do {
          r = r + 1;
        } while (((int)*r & 0xc0U) == 0x80);
        offset = 0;
      }
    }
    do {
      s = s + 1;
    } while (((int)*s & 0xc0U) == 0x80);
    chars = chars + 1;
  } while( true );
}

Assistant:

size_t utf8cspn(const void *src, const void *reject) {
  const char *s = (const char *)src;
  size_t chars = 0;

  while ('\0' != *s) {
    const char *r = (const char *)reject;
    size_t offset = 0;

    while ('\0' != *r) {
      // checking that if *r is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *r)) && (0 < offset)) {
        return chars;
      } else {
        if (*r == s[offset]) {
          // part of a utf8 codepoint matched, so move our checking
          // onwards to the next byte
          offset++;
          r++;
        } else {
          // r could be in the middle of an unmatching utf8 code point,
          // so we need to march it on to the next character beginning,

          do {
            r++;
          } while (0x80 == (0xc0 & *r));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // the current utf8 codepoint in src did not match reject, but src
    // could have been partway through a utf8 codepoint, so we need to
    // march it onto the next utf8 codepoint starting byte
    do {
      s++;
    } while ((0x80 == (0xc0 & *s)));
    chars++;
  }

  return chars;
}